

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
               (TSTNode<unsigned_int> *node,size_t depth)

{
  ostream *poVar1;
  DI local_20;
  DI __d;
  size_t depth_local;
  TSTNode<unsigned_int> *node_local;
  
  __d.i = (string *)depth;
  if (node->pivot == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"verify_tst");
    poVar1 = std::operator<<(poVar1,"() pivot=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,node->pivot);
    poVar1 = std::operator<<(poVar1," depth=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)__d.i);
    std::operator<<(poVar1,'\n');
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"verify_tst");
    poVar1 = std::operator<<(poVar1,"() pivot=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,node->pivot);
    poVar1 = std::operator<<(poVar1," depth=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)__d.i);
    std::operator<<(poVar1,'\n');
  }
  verify_tst<std::vector<unsigned_char*,std::
  allocator<unsigned_char*>>,unsigned_int>(TSTNode<unsigned_int>*,unsigned_long)::DI::DI(std::
  __cxx11::string__(&local_20,(string *)__debug_indent_str_abi_cxx11_);
  verify_bucket<0u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
            (node,(size_t)__d.i);
  verify_bucket<1u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
            (node,(size_t)__d.i);
  verify_bucket<2u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
            (node,(size_t)__d.i);
  verify_tst<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_unsigned_int>::DI::~DI
            (&local_20);
  return true;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}